

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-attack.c
# Opt level: O2

wchar_t choose_attack_spell(bitflag *f,_Bool innate,_Bool non_innate)

{
  _Bool _Var1;
  long lVar2;
  wchar_t index;
  uint32_t uVar3;
  uint8_t spells [92];
  
  for (lVar2 = 0; lVar2 != 0x5c; lVar2 = lVar2 + 1) {
    spells[lVar2] = '\0';
  }
  index = L'\x01';
  uVar3 = 0;
  do {
    if (index == L'\\') {
      uVar3 = Rand_div(uVar3);
      return (wchar_t)spells[(int)uVar3];
    }
    if (innate) {
LAB_0016009c:
      if (!non_innate) {
        _Var1 = mon_spell_is_innate(index);
        if (!_Var1) goto LAB_001600d6;
      }
      _Var1 = flag_has_dbg(f,0xc,index,"f","i");
      if (_Var1) {
        lVar2 = (long)(int)uVar3;
        uVar3 = uVar3 + 1;
        spells[lVar2] = (uint8_t)index;
      }
    }
    else {
      _Var1 = mon_spell_is_innate(index);
      if (!_Var1) goto LAB_0016009c;
    }
LAB_001600d6:
    index = index + L'\x01';
  } while( true );
}

Assistant:

int choose_attack_spell(bitflag *f, bool innate, bool non_innate)
{
	int num = 0;
	uint8_t spells[RSF_MAX];

	int i;

	/* Paranoid initialization */
	for (i = 0; i < RSF_MAX; i++) {
		spells[i] = 0;
	}

	/* Extract spells, filtering as necessary */
	for (i = FLAG_START, num = 0; i < RSF_MAX; i++) {
		if (!innate && mon_spell_is_innate(i)) continue;
		if (!non_innate && !mon_spell_is_innate(i)) continue;
		if (rsf_has(f, i)) spells[num++] = i;
	}

	/* Pick at random */
	return (spells[randint0(num)]);
}